

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O3

int secp256k1_musig_pubkey_agg_callback(secp256k1_scalar *sc,secp256k1_ge *pt,size_t idx,void *data)

{
  undefined1 uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  undefined8 extraout_RAX;
  secp256k1_ge *a;
  secp256k1_context *ctx;
  
  ctx = *data;
  a = pt;
  iVar5 = secp256k1_pubkey_load
                    (ctx,pt,*(secp256k1_pubkey **)(*(long *)((long)data + 0x28) + idx * 8));
  if (iVar5 != 0) {
    secp256k1_musig_keyaggcoef_internal
              (sc,(uchar *)((long)data + 8),pt,(secp256k1_ge *)((long)data + 0x30));
    return 1;
  }
  secp256k1_musig_pubkey_agg_callback_cold_1();
  (ctx->ecmult_gen_ctx).built = -0x2044520c;
  secp256k1_ge_to_bytes((uchar *)&(ctx->ecmult_gen_ctx).scalar_offset,a);
  secp256k1_ge_to_bytes_ext((uchar *)((long)(ctx->ecmult_gen_ctx).ge_offset.y.n + 0xc),a + 1);
  uVar2 = a[2].x.n[0];
  uVar3 = a[2].x.n[1];
  uVar4 = a[2].x.n[3];
  *(uint64_t *)((long)(ctx->ecmult_gen_ctx).proj_blind.n + 0x24) = a[2].x.n[2];
  *(uint64_t *)&(ctx->ecmult_gen_ctx).proj_blind.normalized = uVar4;
  *(uint64_t *)((long)(ctx->ecmult_gen_ctx).proj_blind.n + 0x14) = uVar2;
  *(uint64_t *)((long)(ctx->ecmult_gen_ctx).proj_blind.n + 0x1c) = uVar3;
  *(undefined1 *)((long)&(ctx->illegal_callback).fn + 4) = *(undefined1 *)((long)a[2].x.n + 0x24);
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)a[2].x.n[4]);
  *(undefined8 *)((long)&(ctx->error_callback).fn + 5) = 0;
  *(undefined8 *)((long)&(ctx->error_callback).data + 5) = 0;
  *(undefined8 *)((long)&(ctx->illegal_callback).fn + 5) = 0;
  *(undefined8 *)((long)&(ctx->illegal_callback).data + 5) = 0;
  *(undefined1 *)((long)&ctx->declassify + 1) = *(undefined1 *)((long)a[2].x.n + 0x23);
  *(undefined1 *)((long)&ctx->declassify + 2) = *(undefined1 *)((long)a[2].x.n + 0x22);
  *(undefined1 *)((long)&ctx->declassify + 3) = *(undefined1 *)((long)a[2].x.n + 0x21);
  uVar1 = (undefined1)a[2].x.n[4];
  ctx->field_0xc4 = uVar1;
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),uVar1);
}

Assistant:

static int secp256k1_musig_pubkey_agg_callback(secp256k1_scalar *sc, secp256k1_ge *pt, size_t idx, void *data) {
    secp256k1_musig_pubkey_agg_ecmult_data *ctx = (secp256k1_musig_pubkey_agg_ecmult_data *) data;
    int ret;
    ret = secp256k1_pubkey_load(ctx->ctx, pt, ctx->pks[idx]);
#ifdef VERIFY
    /* pubkey_load can't fail because the same pks have already been loaded in
     * `musig_compute_pks_hash` (and we test this). */
    VERIFY_CHECK(ret);
#else
    (void) ret;
#endif
    secp256k1_musig_keyaggcoef_internal(sc, ctx->pks_hash, pt, &ctx->second_pk);
    return 1;
}